

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppwriteinitialization.cpp
# Opt level: O3

void __thiscall CPP::WriteInitialization::acceptAction(WriteInitialization *this,DomAction *node)

{
  Driver *pDVar1;
  QArrayData *pQVar2;
  Data *pDVar3;
  char16_t *pcVar4;
  Data *pDVar5;
  qsizetype qVar6;
  iterator iVar7;
  iterator iVar8;
  QTextStream *pQVar9;
  long in_FS_OFFSET;
  QByteArrayView QVar10;
  QString local_a8;
  QString local_88;
  QString local_68;
  DomPropertyList local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (node->m_has_attr_menu == false) {
    local_68.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_68.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_68.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    Driver::findOrInsertAction(&local_68,this->m_driver,node);
    local_88.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_88.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_88.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    pDVar1 = this->m_driver;
    iVar7 = QList<DomWidget_*>::end(&(this->m_widgetChain).super_QList<DomWidget_*>);
    Driver::findOrInsertWidget(&local_88,pDVar1,iVar7.i[-1]);
    iVar8 = QList<DomActionGroup_*>::end(&(this->m_actionGroupChain).super_QList<DomActionGroup_*>);
    if (iVar8.i[-1] != (DomActionGroup *)0x0) {
      pDVar1 = this->m_driver;
      iVar8 = QList<DomActionGroup_*>::end
                        (&(this->m_actionGroupChain).super_QList<DomActionGroup_*>);
      Driver::findOrInsertActionGroup((QString *)&local_48,pDVar1,iVar8.i[-1]);
      qVar6 = local_48.d.size;
      pDVar5 = local_48.d.d;
      pcVar4 = local_88.d.ptr;
      pDVar3 = local_88.d.d;
      local_48.d.d = (Data *)local_88.d.d;
      local_88.d.d = (Data *)pDVar5;
      local_88.d.ptr = (char16_t *)local_48.d.ptr;
      local_48.d.ptr = (DomProperty **)pcVar4;
      local_48.d.size = local_88.d.size;
      local_88.d.size = qVar6;
      if (&pDVar3->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&pDVar3->super_QArrayData,2,0x10);
        }
      }
    }
    pQVar9 = (QTextStream *)QTextStream::operator<<(this->m_output,&this->m_indent);
    pQVar9 = (QTextStream *)QTextStream::operator<<(pQVar9,&local_68);
    pQVar9 = (QTextStream *)QTextStream::operator<<(pQVar9," = ");
    pQVar9 = (QTextStream *)QTextStream::operator<<(pQVar9,(QString *)&language::operatorNew);
    pQVar9 = (QTextStream *)QTextStream::operator<<(pQVar9,"QAction(");
    pQVar9 = (QTextStream *)QTextStream::operator<<(pQVar9,&local_88);
    pQVar9 = (QTextStream *)QTextStream::operator<<(pQVar9,')');
    QTextStream::operator<<(pQVar9,(QString *)&language::eol);
    QVar10.m_data = &DAT_00000007;
    QVar10.m_size = (qsizetype)&local_48;
    QString::fromLatin1(QVar10);
    local_a8.d.d = (Data *)local_48.d.d;
    local_a8.d.ptr = (char16_t *)local_48.d.ptr;
    local_a8.d.size = local_48.d.size;
    pQVar2 = &((node->m_property).d.d)->super_QArrayData;
    local_48.d.ptr = (node->m_property).d.ptr;
    local_48.d.size = (node->m_property).d.size;
    local_48.d.d = (Data *)pQVar2;
    if (pQVar2 == (QArrayData *)0x0) {
      writeProperties(this,&local_68,&local_a8,&local_48,0);
    }
    else {
      LOCK();
      (((QArrayData *)&pQVar2->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)&pQVar2->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      writeProperties(this,&local_68,&local_a8,&local_48,0);
      if (pQVar2 != (QArrayData *)0x0) {
        LOCK();
        (((QArrayData *)&pQVar2->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
             (((QArrayData *)&pQVar2->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QArrayData *)&pQVar2->ref_)->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,8,0x10);
        }
      }
    }
    if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void WriteInitialization::acceptAction(DomAction *node)
{
    if (node->hasAttributeMenu())
        return;

    const QString actionName = m_driver->findOrInsertAction(node);
    QString varName = m_driver->findOrInsertWidget(m_widgetChain.top());

    if (m_actionGroupChain.top())
        varName = m_driver->findOrInsertActionGroup(m_actionGroupChain.top());

    m_output << m_indent << actionName << " = " << language::operatorNew
        << "QAction(" << varName << ')' << language::eol;
    writeProperties(actionName, "QAction"_L1, node->elementProperty());
}